

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[28]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char (*args_1) [28])

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_110;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_f0 [40];
  string local_c8 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_a8;
  function<void()> local_90 [32];
  tuple<char_data_*&,_const_char_(&)[28]> tuple;
  anon_class_48_3_3bdf3dc2 local_60;
  
  nTimer_local = nTimer;
  local_110 = func;
  if (nTimer < 0) {
    local_f0._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_f0);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[28]>.
  super__Tuple_impl<1UL,_const_char_(&)[28]>.super__Head_base<1UL,_const_char_(&)[28],_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_(&)[28],_false>)
                 (_Head_base<1UL,_const_char_(&)[28],_false>)args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[28]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_const(&)[28]>(&chs,this,&tuple);
  local_f0._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_f0 + 8),(string *)from);
  std::__cxx11::string::string(local_c8,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_a8,&chs);
  local_60.func = local_110;
  local_60.args = *args;
  local_60._16_1_ = *(char *)((long)args_1 + 0);
  local_60._17_1_ = *(char *)((long)args_1 + 1);
  local_60._18_1_ = *(char *)((long)args_1 + 2);
  local_60._19_1_ = *(char *)((long)args_1 + 3);
  local_60._20_1_ = *(char *)((long)args_1 + 4);
  local_60._21_1_ = *(char *)((long)args_1 + 5);
  local_60._22_1_ = *(char *)((long)args_1 + 6);
  local_60._23_1_ = *(char *)((long)args_1 + 7);
  local_60._36_1_ = *(char *)((long)args_1 + 0x14);
  local_60._37_1_ = *(char *)((long)args_1 + 0x15);
  local_60._38_1_ = *(char *)((long)args_1 + 0x16);
  local_60._39_1_ = *(char *)((long)args_1 + 0x17);
  local_60._40_1_ = *(char *)((long)args_1 + 0x18);
  local_60._41_1_ = *(char *)((long)args_1 + 0x19);
  local_60._42_1_ = *(char *)((long)args_1 + 0x1a);
  local_60._43_1_ = *(char *)((long)args_1 + 0x1b);
  local_60._24_4_ = SUB84(*(undefined8 *)(*args_1 + 8),0);
  local_60._28_4_ = SUB84(*(undefined8 *)(*args_1 + 0xc),0);
  local_60._32_4_ = SUB84((ulong)*(undefined8 *)(*args_1 + 0xc) >> 0x20,0);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[28]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[28])::_lambda()_1_,void>
            (local_90,&local_60);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_f0);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_f0);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}